

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetEffectiveFolderName_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue targetFolder;
  cmGeneratorTarget *this_local;
  string *effectiveFolder;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2c])();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FOLDER",&local_59);
    local_38 = GetProperty(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    bVar1 = cmValue::operator_cast_to_bool(&local_38);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_38);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetEffectiveFolderName() const
{
  std::string effectiveFolder;

  if (!this->GlobalGenerator->UseFolderProperty()) {
    return effectiveFolder;
  }

  cmValue targetFolder = this->GetProperty("FOLDER");
  if (targetFolder) {
    effectiveFolder += *targetFolder;
  }

  return effectiveFolder;
}